

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalValenceEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  size_t sVar5;
  MeshEdgebreakerEncoderImplInterface *pMVar6;
  reference this_00;
  int in_ESI;
  MeshEdgebreakerTraversalEncoder *in_RDI;
  int context;
  int clamped_valence;
  int num_right_faces;
  int new_vert_id;
  CornerIndex act_c;
  int num_left_faces;
  int active_valence;
  CornerIndex prev;
  CornerIndex next;
  CornerTable *in_stack_fffffffffffffed8;
  pointer *in_stack_fffffffffffffee0;
  CornerTable *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  int local_78;
  ThisIndexType local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  ThisIndexType local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  ThisIndexType local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_28;
  int local_24;
  value_type local_20;
  undefined4 local_1c;
  uint local_18;
  undefined4 local_14;
  uint local_10;
  int local_c;
  
  *(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.field_0x8 =
       *(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.field_0x8 + 1;
  local_14 = *(undefined4 *)
              &in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.field_0x4;
  local_c = in_ESI;
  local_10 = (uint)CornerTable::Next(in_stack_fffffffffffffee8,
                                     (CornerIndex)(uint)in_stack_fffffffffffffef0);
  local_1c = *(undefined4 *)
              &in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.field_0x4;
  local_18 = (uint)CornerTable::Previous
                             (in_stack_fffffffffffffee8,(CornerIndex)(uint)in_stack_fffffffffffffef0
                             );
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
  ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                *)in_stack_fffffffffffffee0,
               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8);
  pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
           operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                       *)in_stack_fffffffffffffee0,
                      (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                      in_stack_fffffffffffffed8);
  local_20 = *pvVar4;
  switch(local_c) {
  case 0:
  case 1:
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    if (local_c == 1) {
      local_24 = 0;
      local_2c = local_18;
      local_28.value_ =
           (uint)CornerTable::Opposite(in_stack_fffffffffffffed8,(uint)in_stack_fffffffffffffee0);
      while (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                               (&local_28,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                &kInvalidCornerIndex), bVar1) {
        pMVar6 = MeshEdgebreakerTraversalEncoder::encoder_impl(in_RDI);
        local_34 = local_28.value_;
        local_30 = (uint)CornerTable::Face(in_stack_fffffffffffffed8,
                                           (CornerIndex)(uint)in_stack_fffffffffffffee0);
        uVar3 = (*pMVar6->_vptr_MeshEdgebreakerEncoderImplInterface[9])(pMVar6,(ulong)local_30);
        if ((uVar3 & 1) != 0) break;
        local_24 = local_24 + 1;
        local_40 = local_28.value_;
        local_3c = (uint)CornerTable::Next(in_stack_fffffffffffffee8,
                                           (CornerIndex)(uint)in_stack_fffffffffffffef0);
        local_38.value_ =
             (uint)CornerTable::Opposite(in_stack_fffffffffffffed8,(uint)in_stack_fffffffffffffee0);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_28,&local_38);
      }
      iVar2 = local_24 + 1;
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
      ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                    *)in_stack_fffffffffffffee0,
                   (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                   in_stack_fffffffffffffed8);
      pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
               operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                           *)in_stack_fffffffffffffee0,
                          (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                          in_stack_fffffffffffffed8);
      *pvVar4 = iVar2;
      sVar5 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
              size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                    *)0x1a3102);
      local_44 = (uint)sVar5;
      local_48 = 0;
      local_50 = local_10;
      local_4c.value_ =
           (uint)CornerTable::Opposite(in_stack_fffffffffffffed8,(uint)in_stack_fffffffffffffee0);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_28,&local_4c);
      while (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                               (&local_28,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                &kInvalidCornerIndex), bVar1) {
        pMVar6 = MeshEdgebreakerTraversalEncoder::encoder_impl(in_RDI);
        local_58 = local_28.value_;
        local_54 = (uint)CornerTable::Face(in_stack_fffffffffffffed8,
                                           (CornerIndex)(uint)in_stack_fffffffffffffee0);
        uVar3 = (*pMVar6->_vptr_MeshEdgebreakerEncoderImplInterface[9])(pMVar6,(ulong)local_54);
        if ((uVar3 & 1) != 0) break;
        local_48 = local_48 + 1;
        local_5c = local_44;
        local_64 = local_28.value_;
        local_60 = (uint)CornerTable::Next(in_stack_fffffffffffffee8,
                                           (CornerIndex)(uint)in_stack_fffffffffffffef0);
        this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                *)in_stack_fffffffffffffee0,
                               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                               in_stack_fffffffffffffed8);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(this_00,&local_5c);
        CornerTable::Previous
                  (in_stack_fffffffffffffee8,(CornerIndex)(uint)in_stack_fffffffffffffef0);
        local_68.value_ =
             (uint)CornerTable::Opposite(in_stack_fffffffffffffed8,(uint)in_stack_fffffffffffffee0);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_28,&local_68);
      }
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::push_back
                ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                  *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
    }
    break;
  default:
    break;
  case 3:
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -2;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    break;
  case 5:
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -1;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -2;
    break;
  case 7:
    in_stack_fffffffffffffed8 =
         (CornerTable *)
         &in_RDI[1].start_face_encoder_.bits_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -2;
    in_stack_fffffffffffffee0 =
         &in_RDI[1].start_face_encoder_.bits_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -2;
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  *)in_stack_fffffffffffffee0,
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffed8)
    ;
    pvVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_stack_fffffffffffffee0,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffed8);
    *pvVar4 = *pvVar4 + -2;
  }
  if (*(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl != -1) {
    if (local_20 <
        *(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>
                 ._M_impl.field_0xc) {
      local_78 = *(int *)&in_RDI[1].traversal_buffer_.buffer_.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc;
    }
    else if (*(int *)&in_RDI[1].traversal_buffer_.buffer_.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 < local_20)
    {
      local_78 = *(int *)&in_RDI[1].traversal_buffer_.buffer_.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    }
    else {
      local_78 = local_20;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&in_RDI[1].traversal_buffer_.bit_encoder_,
                 (long)(local_78 -
                       *(int *)&in_RDI[1].traversal_buffer_.buffer_.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0,
               (value_type_conflict5 *)in_stack_fffffffffffffed8);
  }
  *(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl = local_c;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh and compute the context that is going to be
    // used to encode the processed symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh (i.e. the decoding is reverse). Adding a new symbol either reduces
    // valences on the vertices or leaves the valence unchanged.

    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);

    // Get valence on the tip corner of the active edge (outgoing edge that is
    // going to be used in reverse decoding of the connectivity to predict the
    // next symbol).
    const int active_valence = vertex_valences_[corner_to_vertex_map_[next]];
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, we need to split the vertex into
          // two and attach all corners on the left and right sides of the split
          // vertex to the respective vertices (see image below). This is
          // necessary since the decoder works in the reverse order and it
          // merges the two vertices only after the split symbol is processed.
          //
          //     * -----
          //    / \--------
          //   /   \--------
          //  /     \-------
          // *-------v-------*
          //  \     /c\     /
          //   \   /   \   /
          //    \ /n S p\ /
          //     *.......*
          //

          // Count the number of faces on the left side of the split vertex and
          // update the valence on the "left vertex".
          int num_left_faces = 0;
          CornerIndex act_c = corner_table_->Opposite(prev);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_left_faces;
            act_c = corner_table_->Opposite(corner_table_->Next(act_c));
          }
          vertex_valences_[corner_to_vertex_map_[last_corner_]] =
              num_left_faces + 1;

          // Create a new vertex for the right side and count the number of
          // faces that should be attached to this vertex.
          const int new_vert_id = static_cast<int>(vertex_valences_.size());
          int num_right_faces = 0;

          act_c = corner_table_->Opposite(next);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_right_faces;
            // Map corners on the right side to the newly created vertex.
            corner_to_vertex_map_[corner_table_->Next(act_c)] = new_vert_id;
            act_c = corner_table_->Opposite(corner_table_->Previous(act_c));
          }
          vertex_valences_.push_back(num_right_faces + 1);
        }
        break;
      case TOPOLOGY_R:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      case TOPOLOGY_L:

        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 2;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      default:
        break;
    }

    if (prev_symbol_ != -1) {
      int clamped_valence;
      if (active_valence < min_valence_) {
        clamped_valence = min_valence_;
      } else if (active_valence > max_valence_) {
        clamped_valence = max_valence_;
      } else {
        clamped_valence = active_valence;
      }

      const int context = clamped_valence - min_valence_;
      context_symbols_[context].push_back(
          edge_breaker_topology_to_symbol_id[prev_symbol_]);
    }

    prev_symbol_ = symbol;
  }